

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  value_type vVar12;
  
  uVar2 = (((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar3 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      if (uVar2 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar11 = (long)(int)uVar3 << 3;
      }
      pdVar10 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar10;
    }
  }
  if (uVar3 != 0) {
    pdVar10 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).right_;
    if (((pFVar5->dx_).num_elts == 0) ||
       ((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar3) {
        uVar11 = 0;
        do {
          vVar12 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar11);
          pdVar10[uVar11] = vVar12;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar6 = (pFVar5->dx_).ptr_to_data;
      pFVar7 = (fadexpr->fadexpr_).right_;
      pFVar8 = (pFVar7->fadexpr_).right_;
      pdVar9 = (pFVar8->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        dVar1 = (pFVar4->fadexpr_).left_.constant_;
        pdVar10[uVar11] =
             dVar1 * pFVar5->val_ * pdVar9[uVar11] +
             ((pFVar7->fadexpr_).left_.constant_ + pFVar8->val_) * pdVar6[uVar11] * dVar1;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar7 = (fadexpr->fadexpr_).right_;
  this->val_ = ((pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_) *
               (pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}